

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_ABCfunctions.cpp
# Opt level: O2

ChQuaternion<double> * __thiscall
chrono::ChFunctionRotation_ABCfunctions::Get_q
          (ChQuaternion<double> *__return_storage_ptr__,ChFunctionRotation_ABCfunctions *this,
          double s)

{
  AngleSet angset;
  double dVar1;
  double dVar2;
  ChVector<double> local_30;
  
  angset = this->angleset;
  dVar1 = s;
  (*((this->angleA).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar2 = s;
  (*((this->angleB).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (*((this->angleC).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_30.m_data[0] = dVar1;
  local_30.m_data[1] = dVar2;
  local_30.m_data[2] = s;
  Angle_to_Quat(__return_storage_ptr__,angset,&local_30);
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> ChFunctionRotation_ABCfunctions::Get_q(double s) const {
	
	return Angle_to_Quat(this->angleset, 
						  ChVector<>(
							this->angleA->Get_y(s),
							this->angleB->Get_y(s),
							this->angleC->Get_y(s)
						  )
						);
}